

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  undefined1 (*pauVar9) [16];
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM3 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  __m128 afVar27;
  binary_op_ratan2 op;
  __m128 _b;
  binary_op_ratan2 local_91;
  long local_90;
  long local_88;
  Mat *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [4];
  
  p_Var1 = this->_vptr_BinaryOp_x86[-3];
  local_80 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
  case 0:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      fVar16 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar15 = 0;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar17._0_4_ = *(float *)*pauVar9 + fVar16;
            auVar17._4_4_ = *(float *)((long)*pauVar9 + 4) + fVar16;
            auVar17._8_4_ = *(float *)((long)*pauVar9 + 8) + fVar16;
            auVar17._12_4_ = *(float *)((long)*pauVar9 + 0xc) + fVar16;
            *pauVar9 = auVar17;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar7 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar7 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            *(float *)((long)*pauVar9 + lVar12 * 4) =
                 *(float *)((long)*pauVar9 + lVar12 * 4) + fVar16;
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    break;
  case 1:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      fVar16 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar15 = 0;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar21._0_4_ = *(float *)*pauVar9 - fVar16;
            auVar21._4_4_ = *(float *)((long)*pauVar9 + 4) - fVar16;
            auVar21._8_4_ = *(float *)((long)*pauVar9 + 8) - fVar16;
            auVar21._12_4_ = *(float *)((long)*pauVar9 + 0xc) - fVar16;
            *pauVar9 = auVar21;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar7 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar7 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            *(float *)((long)*pauVar9 + lVar12 * 4) =
                 *(float *)((long)*pauVar9 + lVar12 * 4) - fVar16;
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    break;
  case 2:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      fVar16 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar15 = 0;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar18._0_4_ = *(float *)*pauVar9 * fVar16;
            auVar18._4_4_ = *(float *)((long)*pauVar9 + 4) * fVar16;
            auVar18._8_4_ = *(float *)((long)*pauVar9 + 8) * fVar16;
            auVar18._12_4_ = *(float *)((long)*pauVar9 + 0xc) * fVar16;
            *pauVar9 = auVar18;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar7 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar7 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            *(float *)((long)*pauVar9 + lVar12 * 4) =
                 *(float *)((long)*pauVar9 + lVar12 * 4) * fVar16;
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    break;
  case 3:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      fVar16 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
      lVar15 = 0;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar19._0_4_ = *(float *)*pauVar9 * fVar16;
            auVar19._4_4_ = *(float *)((long)*pauVar9 + 4) * fVar16;
            auVar19._8_4_ = *(float *)((long)*pauVar9 + 8) * fVar16;
            auVar19._12_4_ = *(float *)((long)*pauVar9 + 0xc) * fVar16;
            *pauVar9 = auVar19;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar7 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar7 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            *(float *)((long)*pauVar9 + lVar12 * 4) =
                 *(float *)((long)*pauVar9 + lVar12 * 4) * fVar16;
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    break;
  case 4:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      fVar16 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar15 = 0;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar6._4_4_ = fVar16;
            auVar6._0_4_ = fVar16;
            auVar6._8_4_ = fVar16;
            auVar6._12_4_ = fVar16;
            auVar22 = maxps(*pauVar9,auVar6);
            *pauVar9 = auVar22;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar7 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar7 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            fVar23 = *(float *)(*pauVar9 + lVar12 * 4);
            if (*(float *)(*pauVar9 + lVar12 * 4) <= fVar16) {
              fVar23 = fVar16;
            }
            *(float *)(*pauVar9 + lVar12 * 4) = fVar23;
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    break;
  case 5:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      fVar16 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar15 = 0;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar5._4_4_ = fVar16;
            auVar5._0_4_ = fVar16;
            auVar5._8_4_ = fVar16;
            auVar5._12_4_ = fVar16;
            auVar22 = minps(*pauVar9,auVar5);
            *pauVar9 = auVar22;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar7 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar7 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            fVar23 = *(float *)(*pauVar9 + lVar12 * 4);
            if (fVar16 <= *(float *)(*pauVar9 + lVar12 * 4)) {
              fVar23 = fVar16;
            }
            *(float *)(*pauVar9 + lVar12 * 4) = fVar23;
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    break;
  case 6:
    local_90 = (long)bottom_top_blob->c;
    if (0 < local_90) {
      local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_88 = 0;
      local_68 = ZEXT416((uint)local_78);
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (local_80->cstep * local_88 * local_80->elemsize + (long)local_80->data);
        local_48[1] = fStack_74;
        local_48[0] = local_78;
        afStack_40[1] = fStack_6c;
        afStack_40[0] = fStack_70;
        if (iVar10 < 4) {
          iVar7 = 0;
        }
        else {
          iVar13 = 0;
          do {
            local_58 = *(float (*) [2])*pauVar9;
            afStack_50 = *(float (*) [2])(*pauVar9 + 8);
            afVar27 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                ((binary_op_pow *)&local_91,(__m128 *)local_58,(__m128 *)local_48);
            auVar4._8_4_ = extraout_XMM0_Dc_01;
            auVar4._0_8_ = afVar27._0_8_;
            auVar4._12_4_ = extraout_XMM0_Dd_01;
            *pauVar9 = auVar4;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar13 + 4;
            iVar14 = iVar13 + 7;
            iVar13 = iVar7;
          } while (iVar14 < iVar10);
        }
        if (iVar10 - iVar7 != 0 && iVar7 <= iVar10) {
          lVar15 = 0;
          do {
            fVar16 = powf(*(float *)(*pauVar9 + lVar15 * 4),(float)local_68._0_4_);
            *(float *)(*pauVar9 + lVar15 * 4) = fVar16;
            lVar15 = lVar15 + 1;
          } while (iVar10 - iVar7 != (int)lVar15);
        }
        local_88 = local_88 + 1;
      } while (local_88 != local_90);
    }
    break;
  case 7:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      fVar16 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar15 = 0;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar20._0_4_ = fVar16 - *(float *)*pauVar9;
            auVar20._4_4_ = fVar16 - *(float *)((long)*pauVar9 + 4);
            auVar20._8_4_ = fVar16 - *(float *)((long)*pauVar9 + 8);
            auVar20._12_4_ = fVar16 - *(float *)((long)*pauVar9 + 0xc);
            *pauVar9 = auVar20;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar7 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar7 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            *(float *)((long)*pauVar9 + lVar12 * 4) =
                 fVar16 - *(float *)((long)*pauVar9 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    break;
  case 8:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      fVar16 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar15 = 0;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar8 < 4) {
          uVar11 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar22 = *pauVar9;
            in_XMM3 = rcpps(in_XMM3,auVar22);
            fVar23 = fVar16 * in_XMM3._0_4_;
            fVar24 = fVar16 * in_XMM3._4_4_;
            fVar25 = fVar16 * in_XMM3._8_4_;
            fVar26 = fVar16 * in_XMM3._12_4_;
            *(float *)*pauVar9 = (fVar16 - auVar22._0_4_ * fVar23) * in_XMM3._0_4_ + fVar23;
            *(float *)(*pauVar9 + 4) = (fVar16 - auVar22._4_4_ * fVar24) * in_XMM3._4_4_ + fVar24;
            *(float *)(*pauVar9 + 8) = (fVar16 - auVar22._8_4_ * fVar25) * in_XMM3._8_4_ + fVar25;
            *(float *)(*pauVar9 + 0xc) =
                 (fVar16 - auVar22._12_4_ * fVar26) * in_XMM3._12_4_ + fVar26;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar7 + 4;
            uVar11 = uVar8 & 0xfffffffc;
          } while (iVar7 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar12 = 0;
          do {
            *(float *)(*pauVar9 + lVar12 * 4) = fVar16 / *(float *)(*pauVar9 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (uVar8 - uVar11 != (int)lVar12);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    break;
  case 9:
    local_90 = (long)bottom_top_blob->c;
    if (0 < local_90) {
      local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_88 = 0;
      local_68 = ZEXT416((uint)local_78);
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (local_80->cstep * local_88 * local_80->elemsize + (long)local_80->data);
        local_48[1] = fStack_74;
        local_48[0] = local_78;
        afStack_40[1] = fStack_6c;
        afStack_40[0] = fStack_70;
        if (iVar10 < 4) {
          iVar7 = 0;
        }
        else {
          iVar13 = 0;
          do {
            local_58 = *(float (*) [2])*pauVar9;
            afStack_50 = *(float (*) [2])(*pauVar9 + 8);
            afVar27 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                                ((binary_op_rpow *)&local_91,(__m128 *)local_58,(__m128 *)local_48);
            auVar3._8_4_ = extraout_XMM0_Dc_00;
            auVar3._0_8_ = afVar27._0_8_;
            auVar3._12_4_ = extraout_XMM0_Dd_00;
            *pauVar9 = auVar3;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar13 + 4;
            iVar14 = iVar13 + 7;
            iVar13 = iVar7;
          } while (iVar14 < iVar10);
        }
        if (iVar10 - iVar7 != 0 && iVar7 <= iVar10) {
          lVar15 = 0;
          do {
            fVar16 = powf((float)local_68._0_4_,*(float *)(*pauVar9 + lVar15 * 4));
            *(float *)(*pauVar9 + lVar15 * 4) = fVar16;
            lVar15 = lVar15 + 1;
          } while (iVar10 - iVar7 != (int)lVar15);
        }
        local_88 = local_88 + 1;
      } while (local_88 != local_90);
    }
    break;
  case 10:
    local_90 = (long)bottom_top_blob->c;
    if (0 < local_90) {
      local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_88 = 0;
      local_68 = ZEXT416((uint)local_78);
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (local_80->cstep * local_88 * local_80->elemsize + (long)local_80->data);
        local_48[1] = fStack_74;
        local_48[0] = local_78;
        afStack_40[1] = fStack_6c;
        afStack_40[0] = fStack_70;
        if (iVar10 < 4) {
          iVar7 = 0;
        }
        else {
          iVar13 = 0;
          do {
            local_58 = *(float (*) [2])*pauVar9;
            afStack_50 = *(float (*) [2])(*pauVar9 + 8);
            afVar27 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                                ((binary_op_atan2 *)&local_91,(__m128 *)local_58,(__m128 *)local_48)
            ;
            auVar2._8_4_ = extraout_XMM0_Dc_02;
            auVar2._0_8_ = afVar27._0_8_;
            auVar2._12_4_ = extraout_XMM0_Dd_02;
            *pauVar9 = auVar2;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar13 + 4;
            iVar14 = iVar13 + 7;
            iVar13 = iVar7;
          } while (iVar14 < iVar10);
        }
        if (iVar10 - iVar7 != 0 && iVar7 <= iVar10) {
          lVar15 = 0;
          do {
            fVar16 = atan2f(*(float *)(*pauVar9 + lVar15 * 4),(float)local_68._0_4_);
            *(float *)(*pauVar9 + lVar15 * 4) = fVar16;
            lVar15 = lVar15 + 1;
          } while (iVar10 - iVar7 != (int)lVar15);
        }
        local_88 = local_88 + 1;
      } while (local_88 != local_90);
    }
    break;
  case 0xb:
    local_90 = (long)bottom_top_blob->c;
    if (0 < local_90) {
      local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_88 = 0;
      local_68 = ZEXT416((uint)local_78);
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      do {
        pauVar9 = (undefined1 (*) [16])
                  (local_80->cstep * local_88 * local_80->elemsize + (long)local_80->data);
        local_48[1] = fStack_74;
        local_48[0] = local_78;
        afStack_40[1] = fStack_6c;
        afStack_40[0] = fStack_70;
        if (iVar10 < 4) {
          iVar7 = 0;
        }
        else {
          iVar13 = 0;
          do {
            local_58 = *(float (*) [2])*pauVar9;
            afStack_50 = *(float (*) [2])(*pauVar9 + 8);
            afVar27 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4
                                (&local_91,(__m128 *)local_58,(__m128 *)local_48);
            auVar22._8_4_ = extraout_XMM0_Dc;
            auVar22._0_8_ = afVar27._0_8_;
            auVar22._12_4_ = extraout_XMM0_Dd;
            *pauVar9 = auVar22;
            pauVar9 = pauVar9 + 1;
            iVar7 = iVar13 + 4;
            iVar14 = iVar13 + 7;
            iVar13 = iVar7;
          } while (iVar14 < iVar10);
        }
        if (iVar10 - iVar7 != 0 && iVar7 <= iVar10) {
          lVar15 = 0;
          do {
            fVar16 = atan2f((float)local_68._0_4_,*(float *)(*pauVar9 + lVar15 * 4));
            *(float *)(*pauVar9 + lVar15 * 4) = fVar16;
            lVar15 = lVar15 + 1;
          } while (iVar10 - iVar7 != (int)lVar15);
        }
        local_88 = local_88 + 1;
      } while (local_88 != local_90);
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_functor;

    if (op_type == Operation_ADD) return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);
    if (op_type == Operation_SUB) return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);
    if (op_type == Operation_MUL) return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);
    if (op_type == Operation_DIV) return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);
    if (op_type == Operation_MAX) return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);
    if (op_type == Operation_MIN) return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);
    if (op_type == Operation_POW) return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);
    if (op_type == Operation_RSUB) return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);
    if (op_type == Operation_RDIV) return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);
    if (op_type == Operation_RPOW) return binary_op_scalar_inplace<binary_op_rpow>(bottom_top_blob, b, opt);
    if (op_type == Operation_ATAN2) return binary_op_scalar_inplace<binary_op_atan2>(bottom_top_blob, b, opt);
    if (op_type == Operation_RATAN2) return binary_op_scalar_inplace<binary_op_ratan2>(bottom_top_blob, b, opt);

    return 0;
}